

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_diag_mask_inf_impl(ggml_context *ctx,ggml_tensor *a,int n_past,_Bool inplace)

{
  ggml_tensor *tensor;
  undefined3 in_register_00000009;
  int32_t params [1];
  
  if (CONCAT31(in_register_00000009,inplace) == 0) {
    tensor = ggml_dup_tensor(ctx,a);
  }
  else {
    tensor = ggml_view_tensor(ctx,a);
  }
  params[0] = n_past;
  ggml_set_op_params(tensor,params,4);
  tensor->op = GGML_OP_DIAG_MASK_INF;
  tensor->src[0] = a;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_diag_mask_inf_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_past,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    int32_t params[] = { n_past };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_DIAG_MASK_INF;
    result->src[0] = a;

    return result;
}